

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O0

void Fraig_FeedBack(Fraig_Man_t *p,int *pModel,Msat_IntVec_t *vVars,Fraig_Node_t *pOld,
                   Fraig_Node_t *pNew)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  abctime clk;
  int i;
  int nWords;
  int nVarsPi;
  Fraig_Node_t *pNew_local;
  Fraig_Node_t *pOld_local;
  Msat_IntVec_t *vVars_local;
  int *pModel_local;
  Fraig_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  iVar1 = Fraig_FeedBackPrepare(p,pModel,vVars);
  iVar1 = Fraig_FeedBackInsert(p,iVar1);
  if (p->iWordStart + iVar1 <= p->nWordsDyna) {
    for (clk._4_4_ = 1; clk._4_4_ < p->vNodes->nSize; clk._4_4_ = clk._4_4_ + 1) {
      iVar2 = Fraig_NodeIsAnd(p->vNodes->pArray[clk._4_4_]);
      if (iVar2 != 0) {
        Fraig_NodeSimulate(p->vNodes->pArray[clk._4_4_],p->iWordStart,p->iWordStart + iVar1,0);
      }
    }
    if (p->fDoSparse != 0) {
      Fraig_TableRehashF0(p,0);
    }
    if (p->fChoicing == 0) {
      Fraig_FeedBackVerify(p,pOld,pNew);
    }
    if (p->iWordStart + iVar1 == p->nWordsDyna) {
      iVar1 = Fraig_FeedBackCompress(p);
      p->iWordStart = iVar1;
    }
    else {
      p->iWordStart = iVar1 + p->iWordStart;
    }
    aVar4 = Abc_Clock();
    p->timeFeed = (aVar4 - aVar3) + p->timeFeed;
    return;
  }
  __assert_fail("p->iWordStart + nWords <= p->nWordsDyna",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigFeed.c"
                ,0x5b,
                "void Fraig_FeedBack(Fraig_Man_t *, int *, Msat_IntVec_t *, Fraig_Node_t *, Fraig_Node_t *)"
               );
}

Assistant:

void Fraig_FeedBack( Fraig_Man_t * p, int * pModel, Msat_IntVec_t * vVars, Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    int nVarsPi, nWords;
    int i;
    abctime clk = Abc_Clock();

    // get the number of PI vars in the feedback (also sets the PI values)
    nVarsPi = Fraig_FeedBackPrepare( p, pModel, vVars );

    // set the PI values
    nWords = Fraig_FeedBackInsert( p, nVarsPi );
    assert( p->iWordStart + nWords <= p->nWordsDyna );

    // resimulates the words from p->iWordStart to iWordStop
    for ( i = 1; i < p->vNodes->nSize; i++ )
        if ( Fraig_NodeIsAnd(p->vNodes->pArray[i]) )
            Fraig_NodeSimulate( p->vNodes->pArray[i], p->iWordStart, p->iWordStart + nWords, 0 );

    if ( p->fDoSparse )
        Fraig_TableRehashF0( p, 0 );

    if ( !p->fChoicing )
    Fraig_FeedBackVerify( p, pOld, pNew );

    // if there is no room left, compress the patterns
    if ( p->iWordStart + nWords == p->nWordsDyna )
        p->iWordStart = Fraig_FeedBackCompress( p );
    else  // otherwise, update the starting word
        p->iWordStart += nWords;

p->timeFeed += Abc_Clock() - clk;
}